

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall
spv::Builder::createRvalueSwizzle
          (Builder *this,Decoration precision,Id typeId,Id source,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *channels)

{
  uint *puVar1;
  pointer ppIVar2;
  Instruction *pIVar3;
  Id IVar4;
  uint uVar5;
  Id *pIVar6;
  Instruction *this_00;
  pointer puVar7;
  long lVar8;
  size_type __n;
  vector<unsigned_int,_std::allocator<unsigned_int>_> operands;
  _Head_base<0UL,_spv::Instruction_*,_false> local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  puVar1 = (channels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar8 = (long)(channels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1;
  if (lVar8 == 4) {
    IVar4 = createCompositeExtract(this,source,typeId,*puVar1);
    if (IVar4 == 0 || precision == DecorationMax) {
      return IVar4;
    }
  }
  else {
    if (this->generatingOpCodeForSpecConst == true) {
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pIVar6 = (Id *)operator_new(8);
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = pIVar6 + 2;
      pIVar6[0] = 0;
      pIVar6[1] = 0;
      pIVar6[1] = source;
      *pIVar6 = source;
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = pIVar6;
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      IVar4 = createSpecConstantOp(this,OpVectorShuffle,typeId,&local_48,channels);
      if (IVar4 != 0 && precision != DecorationMax) {
        addDecoration(this,IVar4,precision,-1);
      }
      operator_delete(pIVar6,8);
      return IVar4;
    }
    this_00 = (Instruction *)operator_new(0x60);
    IVar4 = this->uniqueId + 1;
    this->uniqueId = IVar4;
    this_00->_vptr_Instruction = (_func_int **)&PTR__Instruction_00b0d9f8;
    this_00->resultId = IVar4;
    this_00->typeId = typeId;
    this_00->opCode = OpVectorShuffle;
    (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    uVar5 = 0;
    (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._M_offset = 0;
    (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_offset = 0;
    (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_end_of_storage = (_Bit_pointer)0x0;
    this_00->block = (Block *)0x0;
    ppIVar2 = (this->module).idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pIVar3 = ppIVar2[source];
    if (pIVar3 != (Instruction *)0x0) {
      uVar5 = pIVar3->typeId;
    }
    if (ppIVar2[uVar5]->opCode != OpTypeVector) {
      __assert_fail("isVector(source)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                    ,0xbaf,
                    "Id spv::Builder::createRvalueSwizzle(Decoration, Id, Id, const std::vector<unsigned int> &)"
                   );
    }
    __n = (lVar8 >> 2) + 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&this_00->operands,__n);
    std::vector<bool,_std::allocator<bool>_>::reserve(&this_00->idOperand,__n);
    Instruction::addIdOperand(this_00,source);
    Instruction::addIdOperand(this_00,source);
    puVar7 = (channels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(channels->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar7) >> 2)) {
      lVar8 = 0;
      do {
        Instruction::addImmediateOperand(this_00,puVar7[lVar8]);
        lVar8 = lVar8 + 1;
        puVar7 = (channels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_start;
      } while (lVar8 < (int)((ulong)((long)(channels->
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)puVar7) >> 2));
    }
    local_50._M_head_impl = this_00;
    addInstruction(this,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                        &local_50);
    if (local_50._M_head_impl != (Instruction *)0x0) {
      (*(local_50._M_head_impl)->_vptr_Instruction[1])();
    }
    local_50._M_head_impl = (Instruction *)0x0;
    IVar4 = this_00->resultId;
    if (IVar4 == 0 || precision == DecorationMax) {
      return IVar4;
    }
  }
  addDecoration(this,IVar4,precision,-1);
  return IVar4;
}

Assistant:

Id Builder::createRvalueSwizzle(Decoration precision, Id typeId, Id source, const std::vector<unsigned>& channels)
{
    if (channels.size() == 1)
        return setPrecision(createCompositeExtract(source, typeId, channels.front()), precision);

    if (generatingOpCodeForSpecConst) {
        std::vector<Id> operands(2);
        operands[0] = operands[1] = source;
        return setPrecision(createSpecConstantOp(OpVectorShuffle, typeId, operands, channels), precision);
    }
    Instruction* swizzle = new Instruction(getUniqueId(), typeId, OpVectorShuffle);
    assert(isVector(source));
    swizzle->reserveOperands(channels.size() + 2);
    swizzle->addIdOperand(source);
    swizzle->addIdOperand(source);
    for (int i = 0; i < (int)channels.size(); ++i)
        swizzle->addImmediateOperand(channels[i]);
    addInstruction(std::unique_ptr<Instruction>(swizzle));

    return setPrecision(swizzle->getResultId(), precision);
}